

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  ulong uVar2;
  quint24 color_00;
  long count;
  quint24 *dest;
  long in_FS_OFFSET;
  quint32 c32;
  quint24 c24;
  uint local_40;
  quint24 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = rasterBuffer->format;
  local_40 = QRgba64::toArgb32(color);
  local_3c.data[0] = 0xaa;
  local_3c.data[1] = 0xaa;
  local_3c.data[2] = 0xaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            (local_3c.data,&local_40,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  color_00.data = local_3c.data;
  uVar2 = rasterBuffer->bytes_per_line;
  dest = (quint24 *)(rasterBuffer->m_buffer + (long)y * uVar2 + (long)x * 3);
  count = (long)width;
  if ((uVar2 & 0xffffffff) == count * 3) {
    qt_memfill24(dest,local_3c,height * count);
  }
  else if (0 < height) {
    do {
      qt_memfill24(dest,color_00,count);
      dest = (quint24 *)((long)dest->data + uVar2);
      height = height + -1;
    } while (height != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint24 c24;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c24), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint24>(reinterpret_cast<quint24 *>(rasterBuffer->buffer()),
                         c24, x, y, width, height, rasterBuffer->bytesPerLine());
}